

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  uint uVar1;
  Parse *pParse_00;
  ulong uVar2;
  ulong uVar3;
  WhereLoop *pWVar4;
  ulong *puVar5;
  ulong *puVar6;
  i8 iVar7;
  short sVar8;
  LogEst LVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  short in_SI;
  WhereInfo *in_RDI;
  long in_FS_OFFSET;
  int nOrder;
  int rc_1;
  u32 wsFlags;
  int rc;
  WhereLevel *pLevel;
  Bitmask maskNew;
  i8 isOrdered;
  LogEst rUnsort;
  LogEst rCost;
  LogEst nOut;
  int nSpace;
  char *pSpace;
  LogEst *aSortCost;
  WhereLoop **pX;
  WhereLoop *pWLoop;
  WherePath *pTo;
  WherePath *pFrom;
  WherePath *aTo;
  WherePath *aFrom;
  int nFrom;
  int nTo;
  LogEst mxUnsort;
  LogEst mxCost;
  int nOrderBy;
  int mxI;
  int jj;
  int ii;
  int iLoop;
  Parse *pParse;
  int nLoop;
  int mxChoice;
  Bitmask revMask_1;
  Bitmask m;
  Bitmask notUsed;
  Bitmask revMask;
  undefined1 *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  byte local_bb;
  LogEst local_ba;
  short local_b8;
  ulong *local_a8;
  ulong *local_a0;
  WhereLoop *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  int local_70;
  int local_6c;
  short local_68;
  short local_66;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int iVar14;
  int local_2c;
  WhereLoop *in_stack_ffffffffffffffd8;
  Bitmask BVar15;
  Bitmask in_stack_ffffffffffffffe0;
  undefined4 uVar16;
  WherePath *in_stack_ffffffffffffffe8;
  ExprList *in_stack_fffffffffffffff0;
  WhereInfo *pWInfo_00;
  
  pWInfo_00 = *(WhereInfo **)(in_FS_OFFSET + 0x28);
  local_60 = 0;
  local_66 = 0;
  local_68 = 0;
  local_a8 = (ulong *)0x0;
  pParse_00 = in_RDI->pParse;
  uVar10 = (uint)in_RDI->nLevel;
  if (uVar10 < 2) {
    iVar14 = 1;
  }
  else if (uVar10 == 2) {
    iVar14 = 5;
  }
  else if (pParse_00->nErr == 0) {
    iVar14 = computeMxChoice(in_RDI);
  }
  else {
    iVar14 = 1;
  }
  if ((in_RDI->pOrderBy == (ExprList *)0x0) || (in_SI == 0)) {
    local_64 = 0;
  }
  else {
    local_64 = in_RDI->pOrderBy->nExpr;
  }
  local_80 = (ulong *)sqlite3DbMallocRawNN
                                ((sqlite3 *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (local_80 == (ulong *)0x0) {
    local_2c = 7;
  }
  else {
    local_78 = local_80 + (long)iVar14 * 4;
    memset(local_78,0,0x20);
    local_a0 = local_78 + (long)iVar14 * 4;
    local_88 = local_80;
    for (local_58 = iVar14 << 1; 0 < local_58; local_58 = local_58 + -1) {
      local_88[3] = (ulong)local_a0;
      local_88 = local_88 + 4;
      local_a0 = local_a0 + (int)uVar10;
    }
    if (local_64 != 0) {
      local_a8 = local_a0;
      memset(local_a0,0,(long)local_64 << 1);
    }
    if (pParse_00->nQueryLoop < 0x30) {
      iVar11 = (int)pParse_00->nQueryLoop;
    }
    else {
      iVar11 = 0x30;
    }
    *(short *)(local_78 + 2) = (short)iVar11;
    local_70 = 1;
    if (local_64 != 0) {
      in_stack_ffffffffffffff18 = local_64;
      if (uVar10 != 0) {
        in_stack_ffffffffffffff18 = -1;
      }
      *(char *)((long)local_78 + 0x16) = (char)in_stack_ffffffffffffff18;
    }
    for (local_54 = 0; puVar6 = local_80, local_54 < (int)uVar10; local_54 = local_54 + 1) {
      local_6c = 0;
      local_88 = local_78;
      for (local_58 = 0; local_58 < local_70; local_58 = local_58 + 1) {
        for (local_98 = in_RDI->pLoops; local_98 != (WhereLoop *)0x0; local_98 = local_98->pNextLoop
            ) {
          in_stack_fffffffffffffff0 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          if ((((local_98->prereq & (*local_88 ^ 0xffffffffffffffff)) == 0) &&
              ((local_98->maskSelf & *local_88) == 0)) &&
             (((local_98->wsFlags & 0x4000) == 0 || (2 < (short)local_88[2])))) {
            local_ba = local_98->rRun + (short)local_88[2];
            if (local_98->rSetup != 0) {
              local_ba = sqlite3LogEstAdd(local_98->rSetup,local_ba);
            }
            local_b8 = sqlite3LogEstAdd(local_ba,*(LogEst *)((long)local_88 + 0x14));
            sVar8 = (short)local_88[2] + local_98->nOut;
            uVar2 = *local_88;
            uVar3 = local_98->maskSelf;
            local_bb = *(byte *)((long)local_88 + 0x16);
            if ((char)local_bb < '\0') {
              in_stack_fffffffffffffff0 = (ExprList *)0x0;
              in_stack_ffffffffffffff08 = &stack0xfffffffffffffff0;
              local_bb = wherePathSatisfiesOrderBy
                                   (pWInfo_00,(ExprList *)0x0,in_stack_ffffffffffffffe8,
                                    (u16)(in_stack_ffffffffffffffe0 >> 0x30),
                                    (u16)(in_stack_ffffffffffffffe0 >> 0x20),
                                    in_stack_ffffffffffffffd8,_wsFlags);
            }
            else {
              in_stack_fffffffffffffff0 = (ExprList *)local_88[1];
            }
            if (((char)local_bb < '\0') || (local_64 <= (char)local_bb)) {
              local_ba = local_b8 + -2;
            }
            else {
              if (*(short *)((long)local_a8 + (long)(char)local_bb * 2) == 0) {
                LVar9 = whereSortingCost((WhereInfo *)
                                         CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10),
                                         (LogEst)((ulong)in_stack_ffffffffffffff08 >> 0x30),
                                         (int)in_stack_ffffffffffffff08,0);
                *(LogEst *)((long)local_a8 + (long)(char)local_bb * 2) = LVar9;
              }
              LVar9 = sqlite3LogEstAdd(local_b8,*(LogEst *)
                                                 ((long)local_a8 + (long)(char)local_bb * 2));
              local_ba = local_b8;
              local_b8 = LVar9 + 3;
            }
            local_5c = 0;
            local_90 = local_80;
            while ((local_5c < local_6c &&
                   ((*local_90 != (uVar2 | uVar3) ||
                    (((int)(char)(*(byte *)((long)local_90 + 0x16) ^ local_bb) & 0x80U) != 0))))) {
              local_5c = local_5c + 1;
              local_90 = local_90 + 4;
            }
            if (local_5c < local_6c) {
              if ((((local_b8 <= *(short *)((long)local_90 + 0x12)) &&
                   ((*(short *)((long)local_90 + 0x12) != local_b8 || (sVar8 <= (short)local_90[2]))
                   )) && ((*(short *)((long)local_90 + 0x12) != local_b8 ||
                          (((short)local_90[2] != sVar8 ||
                           (local_ba <= *(short *)((long)local_90 + 0x14))))))) &&
                 ((*(short *)((long)local_90 + 0x12) != local_b8 ||
                  ((((short)local_90[2] != sVar8 || (*(short *)((long)local_90 + 0x14) != local_ba))
                   || (iVar12 = whereLoopIsNoBetter(local_98,*(WhereLoop **)
                                                              (local_90[3] + (long)local_54 * 8)),
                      iVar12 == 0)))))) goto LAB_001f795b;
            }
            else if ((local_6c < iVar14) ||
                    ((local_b8 <= local_66 && ((local_b8 != local_66 || (local_ba < local_68)))))) {
              if (local_6c < iVar14) {
                local_5c = local_6c;
                local_6c = local_6c + 1;
              }
              else {
                local_5c = local_60;
              }
              local_90 = local_80 + (long)local_5c * 4;
LAB_001f795b:
              *local_90 = *local_88 | local_98->maskSelf;
              local_90[1] = (ulong)in_stack_fffffffffffffff0;
              *(short *)(local_90 + 2) = sVar8;
              *(short *)((long)local_90 + 0x12) = local_b8;
              *(LogEst *)((long)local_90 + 0x14) = local_ba;
              *(byte *)((long)local_90 + 0x16) = local_bb;
              memcpy((void *)local_90[3],(void *)local_88[3],(long)local_54 << 3);
              *(WhereLoop **)(local_90[3] + (long)local_54 * 8) = local_98;
              if (iVar14 <= local_6c) {
                local_60 = 0;
                local_66 = *(short *)((long)local_80 + 0x12);
                local_68 = (short)local_80[2];
                puVar5 = local_80;
                for (local_5c = 1; local_90 = puVar5 + 4, local_5c < iVar14; local_5c = local_5c + 1
                    ) {
                  if ((local_66 < *(short *)((long)puVar5 + 0x32)) ||
                     ((*(short *)((long)puVar5 + 0x32) == local_66 &&
                      (local_68 < *(short *)((long)puVar5 + 0x34))))) {
                    local_66 = *(short *)((long)puVar5 + 0x32);
                    local_68 = *(short *)((long)puVar5 + 0x34);
                    local_60 = local_5c;
                  }
                  puVar5 = local_90;
                }
              }
            }
          }
        }
        local_88 = local_88 + 4;
      }
      local_80 = local_78;
      local_78 = puVar6;
      local_70 = local_6c;
    }
    if (local_70 == 0) {
      sqlite3ErrorMsg(pParse_00,"no query solution");
      sqlite3DbFreeNN((sqlite3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (void *)CONCAT44(iVar11,in_stack_ffffffffffffff18));
      local_2c = 1;
    }
    else {
      local_88 = local_78;
      for (local_58 = 1; local_58 < local_70; local_58 = local_58 + 1) {
        if (*(short *)((long)local_78 + (long)local_58 * 0x20 + 0x12) <
            *(short *)((long)local_88 + 0x12)) {
          local_88 = local_78 + (long)local_58 * 4;
        }
      }
      for (local_54 = 0; local_54 < (int)uVar10; local_54 = local_54 + 1) {
        lVar13 = (long)local_54;
        pWVar4 = *(WhereLoop **)(local_88[3] + (long)local_54 * 8);
        in_RDI->a[lVar13].pWLoop = pWVar4;
        in_RDI->a[lVar13].iFrom = pWVar4->iTab;
        in_RDI->a[lVar13].iTabCur = in_RDI->pTabList->a[in_RDI->a[lVar13].iFrom].iCursor;
      }
      if (((((in_RDI->wctrlFlags & 0x100) != 0) && ((in_RDI->wctrlFlags & 0x80) == 0)) &&
          (in_RDI->eDistinct == '\0')) && (in_SI != 0)) {
        in_stack_ffffffffffffffe8 = (WherePath *)&DAT_aaaaaaaaaaaaaaaa;
        iVar7 = wherePathSatisfiesOrderBy
                          (pWInfo_00,in_stack_fffffffffffffff0,(WherePath *)&DAT_aaaaaaaaaaaaaaaa,
                           (u16)(in_stack_ffffffffffffffe0 >> 0x30),
                           (u16)(in_stack_ffffffffffffffe0 >> 0x20),in_stack_ffffffffffffffd8,
                           _wsFlags);
        if ((int)iVar7 == in_RDI->pResultSet->nExpr) {
          in_RDI->eDistinct = '\x02';
        }
      }
      uVar16 = (undefined4)(in_stack_ffffffffffffffe0 >> 0x20);
      in_RDI->field_0x44 = in_RDI->field_0x44 & 0xfb;
      if (in_RDI->pOrderBy != (ExprList *)0x0) {
        in_RDI->nOBSat = *(i8 *)((long)local_88 + 0x16);
        if ((in_RDI->wctrlFlags & 0x80) == 0) {
          in_RDI->revMask = local_88[1];
          if (in_RDI->nOBSat < '\x01') {
            in_RDI->nOBSat = '\0';
            if (uVar10 != 0) {
              uVar1 = *(uint *)(*(long *)(local_88[3] + (long)(int)(uVar10 - 1) * 8) + 0x30);
              if (((uVar1 & 0x1000) == 0) && ((uVar1 & 0x104) != 0x104)) {
                in_stack_ffffffffffffffe0 = 0;
                iVar7 = wherePathSatisfiesOrderBy
                                  (pWInfo_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0,0
                                   ,in_stack_ffffffffffffffd8,_wsFlags);
                in_stack_ffffffffffffff24 = (int)iVar7;
                if (in_stack_ffffffffffffff24 == in_RDI->pOrderBy->nExpr) {
                  in_RDI->field_0x44 = in_RDI->field_0x44 & 0xfb | 4;
                  in_RDI->revMask = in_stack_ffffffffffffffe0;
                }
              }
              uVar16 = (undefined4)(in_stack_ffffffffffffffe0 >> 0x20);
            }
          }
          else if (((uVar10 != 0) && (in_RDI->nOBSat == '\x01')) && ((in_RDI->wctrlFlags & 3) != 0))
          {
            in_RDI->field_0x44 = in_RDI->field_0x44 & 0xfb | 4;
          }
        }
        else if ((int)*(char *)((long)local_88 + 0x16) == in_RDI->pOrderBy->nExpr) {
          in_RDI->eDistinct = '\x02';
        }
        if ((((in_RDI->wctrlFlags & 0x200) != 0) && ((int)in_RDI->nOBSat == in_RDI->pOrderBy->nExpr)
            ) && (uVar10 != 0)) {
          BVar15 = 0;
          iVar7 = wherePathSatisfiesOrderBy
                            (pWInfo_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                             (u16)((uint)uVar16 >> 0x10),(u16)uVar16,(WhereLoop *)0x0,_wsFlags);
          in_stack_ffffffffffffff20 = (int)iVar7;
          if (in_stack_ffffffffffffff20 == in_RDI->pOrderBy->nExpr) {
            in_RDI->field_0x44 = in_RDI->field_0x44 & 0xf7 | 8;
            in_RDI->revMask = BVar15;
          }
        }
      }
      in_RDI->nRowOut = (LogEst)local_88[2];
      sqlite3DbFreeNN((sqlite3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (void *)CONCAT44(iVar11,in_stack_ffffffffffffff18));
      local_2c = 0;
    }
  }
  if (*(WhereInfo **)(in_FS_OFFSET + 0x28) != pWInfo_00) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsort = 0;      /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));
  /* TUNING: mxChoice is the maximum number of possible paths to preserve
  ** at each step.  Based on the number of loops in the FROM clause:
  **
  **     nLoop      mxChoice
  **     -----      --------
  **       1            1            // the most common case
  **       2            5
  **       3+        12 or 18        // see computeMxChoice()
  */
  if( nLoop<=1 ){
    mxChoice = 1;
  }else if( nLoop==2 ){
    mxChoice = 5;
  }else if( pParse->nErr ){
    mxChoice = 1;
  }else{
    mxChoice = computeMxChoice(pWInfo);
  }
  assert( nLoop<=pWInfo->pTabList->nSrc );

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsort;                   /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsort = pWLoop->rRun + pFrom->nRow;
        if( pWLoop->rSetup ){
          rUnsort = sqlite3LogEstAdd(pWLoop->rSetup, rUnsort);
        }
        rUnsort = sqlite3LogEstAdd(rUnsort, pFrom->rUnsort);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsort, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsort, rCost));
        }else{
          rCost = rUnsort;
          rUnsort -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        testcase( nTo==0 );
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsort>=mxUnsort))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsort) <= (rCost,nOut,rUnsort)
          */
          if( (pTo->rCost<rCost)
           || (pTo->rCost==rCost && pTo->nRow<nOut)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort<rUnsort)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort==rUnsort
                  && whereLoopIsNoBetter(pWLoop, pTo->aLoop[iLoop]) )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsort = rUnsort;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsort = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsort>mxUnsort)
            ){
              mxCost = pTo->rCost;
              mxUnsort = pTo->rUnsort;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      LogEst rMin, rFloor = 0;
      int nDone = 0;
      int nProgress;
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      do{
        nProgress = 0;
        rMin = 0x7fff;
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost>rFloor && pTo->rCost<rMin ) rMin = pTo->rCost;
        }
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost==rMin ){
            sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
               wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
               pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
            if( pTo->isOrdered>0 ){
              sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
            }else{
              sqlite3DebugPrintf("\n");
            }
            nDone++;
            nProgress++;
          }
        }
        rFloor = rMin;
      }while( nDone<nTo && nProgress>0 );
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;
#ifdef WHERETRACE_ENABLED
  pWInfo->rTotalCost = pFrom->rCost;
#endif

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}